

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscrollbar.cpp
# Opt level: O1

void __thiscall QScrollBar::initStyleOption(QScrollBar *this,QStyleOptionSlider *option)

{
  State *pSVar1;
  Orientation OVar2;
  long lVar3;
  undefined8 uVar4;
  int iVar5;
  QStyle *pQVar6;
  
  if (option != (QStyleOptionSlider *)0x0) {
    lVar3 = *(long *)&(this->super_QAbstractSlider).super_QWidget.field_0x8;
    QStyleOption::initFrom((QStyleOption *)option,(QWidget *)this);
    (option->super_QStyleOptionComplex).subControls =
         (QFlagsStorageHelper<QStyle::SubControl,_4>)0x0;
    (option->super_QStyleOptionComplex).activeSubControls =
         (QFlagsStorageHelper<QStyle::SubControl,_4>)0x0;
    OVar2 = *(Orientation *)(lVar3 + 0x280);
    option->orientation = OVar2;
    uVar4 = *(undefined8 *)(lVar3 + 0x254);
    option->minimum = (int)uVar4;
    option->maximum = (int)((ulong)uVar4 >> 0x20);
    uVar4 = *(undefined8 *)(lVar3 + 0x260);
    option->sliderPosition = (int)((ulong)uVar4 >> 0x20);
    option->sliderValue = (int)uVar4;
    option->singleStep = *(int *)(lVar3 + 0x26c);
    option->pageStep = *(int *)(lVar3 + 0x25c);
    option->upsideDown = (bool)(*(byte *)(lVar3 + 0x27c) >> 3 & 1);
    if (OVar2 == Horizontal) {
      pSVar1 = &(option->super_QStyleOptionComplex).super_QStyleOption.state;
      *(byte *)&(pSVar1->super_QFlagsStorageHelper<QStyle::StateFlag,_4>).
                super_QFlagsStorage<QStyle::StateFlag>.i =
           (byte)(pSVar1->super_QFlagsStorageHelper<QStyle::StateFlag,_4>).
                 super_QFlagsStorage<QStyle::StateFlag>.i | 0x80;
    }
    if ((*(char *)(lVar3 + 0x2b5) != '\0') || (*(char *)(lVar3 + 0x2b4) == '\0')) {
      pQVar6 = QWidget::style((QWidget *)this);
      iVar5 = (**(code **)(*(long *)pQVar6 + 0xf0))(pQVar6,0x60,option,this,0);
      if (iVar5 != 0) {
        pSVar1 = &(option->super_QStyleOptionComplex).super_QStyleOption.state;
        *(byte *)&(pSVar1->super_QFlagsStorageHelper<QStyle::StateFlag,_4>).
                  super_QFlagsStorage<QStyle::StateFlag>.i =
             (byte)(pSVar1->super_QFlagsStorageHelper<QStyle::StateFlag,_4>).
                   super_QFlagsStorage<QStyle::StateFlag>.i | 0x20;
      }
    }
  }
  return;
}

Assistant:

void QScrollBar::initStyleOption(QStyleOptionSlider *option) const
{
    if (!option)
        return;

    Q_D(const QScrollBar);
    option->initFrom(this);
    option->subControls = QStyle::SC_None;
    option->activeSubControls = QStyle::SC_None;
    option->orientation = d->orientation;
    option->minimum = d->minimum;
    option->maximum = d->maximum;
    option->sliderPosition = d->position;
    option->sliderValue = d->value;
    option->singleStep = d->singleStep;
    option->pageStep = d->pageStep;
    option->upsideDown = d->invertedAppearance;
    if (d->orientation == Qt::Horizontal)
        option->state |= QStyle::State_Horizontal;
    if ((d->flashed || !d->transient) && style()->styleHint(QStyle::SH_ScrollBar_Transient, option, this))
        option->state |= QStyle::State_On;
}